

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::genFramebuffers(GLContext *this,int numFramebuffers,deUint32 *framebuffers)

{
  deUint32 *framebuffers_local;
  int numFramebuffers_local;
  GLContext *this_local;
  
  glu::CallLogWrapper::glGenFramebuffers(this->m_wrapper,numFramebuffers,framebuffers);
  if (0 < numFramebuffers) {
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
    insert<unsigned_int*>
              ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
               &this->m_allocatedFbos,framebuffers,framebuffers + numFramebuffers);
  }
  return;
}

Assistant:

void GLContext::genFramebuffers (int numFramebuffers, deUint32* framebuffers)
{
	m_wrapper->glGenFramebuffers(numFramebuffers, framebuffers);
	if (numFramebuffers > 0)
		m_allocatedFbos.insert(framebuffers, framebuffers+numFramebuffers);
}